

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

uint64_t load_helper(CPUArchState_conflict30 *env,target_ulong_conflict addr,TCGMemOpIdx oi,
                    uintptr_t retaddr,MemOp op,_Bool code_read,FullLoadHelper_conflict14 *full_load)

{
  uc_struct *puVar1;
  void *pvVar2;
  uc_struct_conflict15 *uc;
  hwaddr hVar3;
  MMUAccessType access_type;
  char cVar4;
  _Bool _Var5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint *puVar9;
  uint *puVar10;
  MemoryRegion *pMVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  MemoryRegionSection *pMVar14;
  byte bVar15;
  int iVar16;
  hwaddr *phVar17;
  uint size;
  MemOp MVar18;
  byte bVar19;
  list_item *plVar20;
  ulong uVar21;
  undefined7 in_register_00000089;
  uint uVar22;
  ulong uVar23;
  uint mmu_idx;
  CPUTriCoreState *__mptr_1;
  uint uVar24;
  ulong uVar25;
  CPUTriCoreState *__mptr;
  ulong local_88;
  uint64_t local_38;
  ulong len;
  ulong mmu_idx_00;
  ulong uVar26;
  
  uVar21 = (ulong)addr;
  mmu_idx = oi & 0xf;
  mmu_idx_00 = (ulong)mmu_idx;
  uVar25 = (ulong)(mmu_idx << 4);
  uVar6 = addr >> 0xe;
  uVar22 = *(uint *)((long)env->gpr_a + (uVar25 - 0x40)) >> 6 & uVar6;
  local_88 = (ulong)uVar22;
  puVar9 = (uint *)((ulong)(uVar22 << 6) + *(long *)((long)env->gpr_a + (uVar25 - 0x38)));
  iVar16 = (int)CONCAT71(in_register_00000089,code_read);
  access_type = iVar16 * 2;
  uVar23 = (ulong)(uint)(iVar16 * 8);
  uVar22 = *(uint *)(uVar23 + (long)puVar9);
  uVar7 = get_alignment_bits(oi >> 4);
  MVar18 = op & MO_64;
  size = 1 << (sbyte)MVar18;
  len = (ulong)size;
  puVar1 = (uc_struct *)env->uc;
  if ((~(-1 << ((byte)uVar7 & 0x1f)) & addr) != 0) {
    (**(code **)(*(long *)&env[-4].end_reset_fields + 0x18))
              (&env[-0x32].cpu_model,uVar21,access_type,mmu_idx,retaddr);
  }
  puVar10 = (uint *)((long)env->gpr_a + (uVar25 - 0x40));
  uVar7 = addr & 0xffffc000;
  if ((uVar22 & 0xffffe000) != uVar7) {
    _Var5 = victim_tlb_hit(env,mmu_idx_00,local_88,uVar23,uVar7);
    if (!_Var5) {
      tlb_fill((CPUState *)&env[-0x32].cpu_model,addr,size,access_type,mmu_idx,retaddr);
      uVar22 = uVar6 & *puVar10 >> 6;
      local_88 = (ulong)uVar22;
      puVar9 = (uint *)((ulong)(uVar22 << 6) + *(long *)((long)env->gpr_a + (uVar25 - 0x38)));
    }
    uVar22 = *(uint *)((long)puVar9 + uVar23) & 0xffffdfff;
  }
  uVar8 = addr & 0x3fff;
  uVar24 = puVar9[3] | uVar8;
  uVar26 = (ulong)uVar24;
  pMVar11 = (*puVar1->memory_mapping)(puVar1,uVar26);
  if (pMVar11 == (MemoryRegion *)0x0) {
    iVar16 = puVar1->invalid_error;
    if (iVar16 == 0) {
      if (code_read) {
        plVar20 = (list_item *)(puVar1->hook + 6);
        do {
          do {
            plVar20 = plVar20->next;
            if ((plVar20 == (list_item *)0x0) || (pvVar2 = plVar20->data, pvVar2 == (void *)0x0))
            goto LAB_00b30658;
          } while ((*(char *)((long)pvVar2 + 0x14) != '\0') ||
                  (*(ulong *)((long)pvVar2 + 0x18) <= *(ulong *)((long)pvVar2 + 0x20) &&
                   (*(ulong *)((long)pvVar2 + 0x20) < uVar26 ||
                   uVar26 < *(ulong *)((long)pvVar2 + 0x18))));
          cVar4 = (**(code **)((long)pvVar2 + 0x28))
                            (puVar1,0x15,uVar26,len,0,*(undefined8 *)((long)pvVar2 + 0x30));
          if (cVar4 != '\0') goto LAB_00b30944;
        } while (puVar1->stop_request == false);
LAB_00b30658:
        iVar16 = 8;
      }
      else {
        plVar20 = (list_item *)(puVar1->hook + 4);
        do {
          do {
            plVar20 = plVar20->next;
            if ((plVar20 == (list_item *)0x0) || (pvVar2 = plVar20->data, pvVar2 == (void *)0x0))
            goto LAB_00b307f1;
          } while ((*(char *)((long)pvVar2 + 0x14) != '\0') ||
                  (*(ulong *)((long)pvVar2 + 0x18) <= *(ulong *)((long)pvVar2 + 0x20) &&
                   (*(ulong *)((long)pvVar2 + 0x20) < uVar26 ||
                   uVar26 < *(ulong *)((long)pvVar2 + 0x18))));
          cVar4 = (**(code **)((long)pvVar2 + 0x28))
                            (puVar1,0x13,uVar26,len,0,*(undefined8 *)((long)pvVar2 + 0x30));
          if (cVar4 != '\0') goto LAB_00b30944;
        } while (puVar1->stop_request == false);
LAB_00b307f1:
        iVar16 = 6;
      }
    }
    puVar1->invalid_addr = uVar26;
    puVar1->invalid_error = iVar16;
    goto LAB_00b30801;
  }
LAB_00b3051c:
  uVar26 = (ulong)uVar24;
  if (code_read) {
    if ((pMVar11->perms & 4) == 0) {
      plVar20 = (list_item *)(puVar1->hook + 9);
      do {
        do {
          plVar20 = plVar20->next;
          if ((plVar20 == (list_item *)0x0) || (pvVar2 = plVar20->data, pvVar2 == (void *)0x0))
          goto LAB_00b305b5;
        } while ((*(char *)((long)pvVar2 + 0x14) != '\0') ||
                (*(ulong *)((long)pvVar2 + 0x18) <= *(ulong *)((long)pvVar2 + 0x20) &&
                 (*(ulong *)((long)pvVar2 + 0x20) < uVar26 ||
                 uVar26 < *(ulong *)((long)pvVar2 + 0x18))));
        cVar4 = (**(code **)((long)pvVar2 + 0x28))
                          (puVar1,0x18,uVar26,len,0,*(undefined8 *)((long)pvVar2 + 0x30));
        if (cVar4 != '\0') {
          puVar1->invalid_error = 0;
          goto LAB_00b3083f;
        }
      } while (puVar1->stop_request == false);
LAB_00b305b5:
      puVar1->invalid_addr = uVar26;
      puVar1->invalid_error = 0xe;
LAB_00b30801:
      if ((0 < puVar1->nested_level) && (puVar1->cpu->stopped == false)) {
        cpu_exit(puVar1->cpu);
        cpu_loop_exit_tricore((CPUState_conflict *)puVar1->cpu);
      }
      return 0;
    }
  }
  else {
    plVar20 = (list_item *)(puVar1->hook + 10);
    do {
      plVar20 = plVar20->next;
      if ((plVar20 == (list_item *)0x0) || (pvVar2 = plVar20->data, pvVar2 == (void *)0x0)) break;
    } while ((*(char *)((long)pvVar2 + 0x14) != '\0') ||
            ((*(ulong *)((long)pvVar2 + 0x18) <= *(ulong *)((long)pvVar2 + 0x20) &&
              (*(ulong *)((long)pvVar2 + 0x20) < uVar26 || uVar26 < *(ulong *)((long)pvVar2 + 0x18))
             || ((**(code **)((long)pvVar2 + 0x28))
                           (env->uc,0x10,uVar26,len,0,*(undefined8 *)((long)pvVar2 + 0x30)),
                puVar1->stop_request != true))));
    if ((pMVar11->perms & 1) == 0) {
      plVar20 = (list_item *)(puVar1->hook + 7);
      do {
        do {
          plVar20 = plVar20->next;
          if ((plVar20 == (list_item *)0x0) || (pvVar2 = plVar20->data, pvVar2 == (void *)0x0))
          goto LAB_00b3075a;
        } while ((*(char *)((long)pvVar2 + 0x14) != '\0') ||
                (*(ulong *)((long)pvVar2 + 0x18) <= *(ulong *)((long)pvVar2 + 0x20) &&
                 (*(ulong *)((long)pvVar2 + 0x20) < uVar26 ||
                 uVar26 < *(ulong *)((long)pvVar2 + 0x18))));
        cVar4 = (**(code **)((long)pvVar2 + 0x28))
                          (puVar1,0x17,uVar26,len,0,*(undefined8 *)((long)pvVar2 + 0x30));
        if (cVar4 != '\0') {
          puVar1->invalid_error = 0;
          if ((uVar22 & 0xffffe000) != uVar7) {
            _Var5 = victim_tlb_hit(env,mmu_idx_00,local_88,uVar23,uVar7);
            if (!_Var5) {
              tlb_fill((CPUState *)&env[-0x32].cpu_model,addr,size,access_type,mmu_idx,retaddr);
              uVar6 = uVar6 & *puVar10 >> 6;
              local_88 = (ulong)uVar6;
              puVar9 = (uint *)((ulong)(uVar6 << 6) + *(long *)((long)env->gpr_a + (uVar25 - 0x38)))
              ;
            }
            uVar22 = *puVar9 & 0xffffdfff;
          }
          goto LAB_00b3083f;
        }
      } while (puVar1->stop_request == false);
LAB_00b3075a:
      puVar1->invalid_addr = uVar26;
      puVar1->invalid_error = 0xd;
      goto LAB_00b30801;
    }
  }
LAB_00b3083f:
  if ((uVar22 & 0x3fff) == 0) {
    if ((MVar18 == MO_8) || (0xffffffffffffbfff < (ulong)(uVar8 + size) - 0x4001)) {
      uVar12 = load_memop((void *)(uVar21 + *(long *)(puVar9 + 4)),op);
      goto LAB_00b30880;
    }
  }
  else if ((addr & size - 1) == 0) {
    phVar17 = (hwaddr *)
              (*(long *)((long)env + mmu_idx_00 * 0x2b0 + -0x5a8) +
              (ulong)(uint)((int)local_88 << 4));
    if ((uVar22 >> 10 & 1) != 0) {
      cpu_check_watchpoint_tricore
                ((CPUState *)&env[-0x32].cpu_model,uVar21,len,*(MemTxAttrs *)(phVar17 + 1),1,retaddr
                );
    }
    bVar19 = (byte)(uVar22 >> 9) & 1 & MVar18 != MO_8;
    if ((uVar22 >> 0xb & 1) == 0) {
      if (bVar19 != 0) {
        op = op ^ MO_BE;
      }
      uVar12 = load_memop((void *)(uVar21 + *(long *)(puVar9 + 4)),op);
    }
    else {
      uc = (uc_struct_conflict15 *)env[-4].timer;
      pMVar14 = iotlb_to_section_tricore
                          ((CPUState *)&env[-0x32].cpu_model,*phVar17,*(MemTxAttrs *)(phVar17 + 1));
      pMVar11 = pMVar14->mr;
      hVar3 = *phVar17;
      env[-4].irq[2] = (void *)retaddr;
      if (*(int *)((long)env[-4].irq + 0x34) == 0) {
        cpu_io_recompile_tricore((CPUState *)&env[-0x32].cpu_model,retaddr);
      }
      memory_region_dispatch_read_tricore
                (uc,(MemoryRegion_conflict *)pMVar11,((uint)hVar3 & 0xffffc000) + uVar21,&local_38,
                 (uint)bVar19 << 3 ^ op,*(MemTxAttrs *)(phVar17 + 1));
      uVar12 = local_38;
    }
    goto LAB_00b30880;
  }
  iVar16 = puVar1->size_recur_mem;
  puVar1->size_recur_mem = size;
  uVar12 = (*full_load)(env,-size & addr,oi,retaddr);
  uVar13 = (*full_load)(env,(-size & addr) + size,oi,retaddr);
  puVar1->size_recur_mem = iVar16;
  cVar4 = (char)size;
  bVar19 = cVar4 - 1U & (byte)addr;
  bVar15 = bVar19 * '\b';
  bVar19 = cVar4 * '\b' + bVar19 * -8;
  if ((op & MO_BE) == MO_8) {
    uVar21 = uVar12 >> (bVar15 & 0x3f);
    uVar23 = uVar13 << (bVar19 & 0x3f);
  }
  else {
    uVar21 = uVar12 << (bVar15 & 0x3f);
    uVar23 = uVar13 >> (bVar19 & 0x3f);
  }
  uVar12 = ((uVar23 | uVar21) << (cVar4 * -8 & 0x3fU)) >> (cVar4 * -8 & 0x3fU);
LAB_00b30880:
  if (code_read) {
    return uVar12;
  }
  if (puVar1->size_recur_mem != 0) {
    return uVar12;
  }
  plVar20 = (list_item *)(puVar1->hook + 0xd);
  while( true ) {
    plVar20 = plVar20->next;
    if (plVar20 == (list_item *)0x0) {
      return uVar12;
    }
    pvVar2 = plVar20->data;
    if (pvVar2 == (void *)0x0) break;
    if (((*(char *)((long)pvVar2 + 0x14) == '\0') &&
        (*(ulong *)((long)pvVar2 + 0x20) < *(ulong *)((long)pvVar2 + 0x18) ||
         uVar26 <= *(ulong *)((long)pvVar2 + 0x20) && *(ulong *)((long)pvVar2 + 0x18) <= uVar26)) &&
       ((**(code **)((long)pvVar2 + 0x28))
                  (env->uc,0x19,uVar26,len,uVar12,*(undefined8 *)((long)pvVar2 + 0x30)),
       puVar1->stop_request == true)) {
      return uVar12;
    }
  }
  return uVar12;
LAB_00b30944:
  puVar1->invalid_error = 0;
  if ((uVar22 & 0xffffe000) != uVar7) {
    _Var5 = victim_tlb_hit(env,mmu_idx_00,local_88,uVar23,uVar7);
    if (!_Var5) {
      tlb_fill((CPUState *)&env[-0x32].cpu_model,addr,size,access_type,mmu_idx,retaddr);
      uVar22 = uVar6 & *puVar10 >> 6;
      local_88 = (ulong)uVar22;
      puVar9 = (uint *)((ulong)(uVar22 << 6) + *(long *)((long)env->gpr_a + (uVar25 - 0x38)));
    }
    uVar22 = *(uint *)((long)puVar9 + uVar23) & 0xffffdfff;
  }
  uVar24 = puVar9[3] | uVar8;
  pMVar11 = (*puVar1->memory_mapping)(puVar1,(hwaddr)uVar24);
  if (pMVar11 == (MemoryRegion *)0x0) {
    puVar1->invalid_error = 0xb;
    goto LAB_00b30801;
  }
  goto LAB_00b3051c;
}

Assistant:

static uint64_t inline
load_helper(CPUArchState *env, target_ulong addr, TCGMemOpIdx oi,
            uintptr_t retaddr, MemOp op, bool code_read,
            FullLoadHelper *full_load)
{
    uintptr_t mmu_idx = get_mmuidx(oi);
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    target_ulong tlb_addr = code_read ? entry->addr_code : entry->addr_read;
    target_ulong paddr;
    const size_t tlb_off = code_read ?
        offsetof(CPUTLBEntry, addr_code) : offsetof(CPUTLBEntry, addr_read);
    const MMUAccessType access_type =
        code_read ? MMU_INST_FETCH : MMU_DATA_LOAD;
    unsigned a_bits = get_alignment_bits(get_memop(oi));
    void *haddr;
    uint64_t res;
    size_t size = memop_size(op);
    int error_code;
    struct hook *hook;
    bool handled;
    HOOK_FOREACH_VAR_DECLARE;
    struct uc_struct *uc = env->uc;
    MemoryRegion *mr;

    /* Handle CPU specific unaligned behaviour */
    if (addr & ((1 << a_bits) - 1)) {
        cpu_unaligned_access(env_cpu(env), addr, access_type,
                             mmu_idx, retaddr);
    }

    /* If the TLB entry is for a different page, reload and try again.  */
    if (!tlb_hit(env->uc, tlb_addr, addr)) {
        if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
                            addr & TARGET_PAGE_MASK)) {
            tlb_fill(env_cpu(env), addr, size,
                     access_type, mmu_idx, retaddr);
            index = tlb_index(env, mmu_idx, addr);
            entry = tlb_entry(env, mmu_idx, addr);
        }
        tlb_addr = code_read ? entry->addr_code : entry->addr_read;
        tlb_addr &= ~TLB_INVALID_MASK;
    }

    paddr = entry->paddr | (addr & ~TARGET_PAGE_MASK);
    mr = uc->memory_mapping(uc, paddr);

    // memory might be still unmapped while reading or fetching
    if (mr == NULL) {
        handled = false;
        // if there is already an unhandled eror, skip callbacks.
        if (uc->invalid_error == UC_ERR_OK) {
            if (code_read) {
                // code fetching
                error_code = UC_ERR_FETCH_UNMAPPED;
                HOOK_FOREACH(uc, hook, UC_HOOK_MEM_FETCH_UNMAPPED) {
                    if (hook->to_delete)
                        continue;
                    if (!HOOK_BOUND_CHECK(hook, paddr))
                        continue;
                    if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_FETCH_UNMAPPED, paddr, size, 0, hook->user_data)))
                        break;

                    // the last callback may already asked to stop emulation
                    if (uc->stop_request)
                        break;
                }
            } else {
                // data reading
                error_code = UC_ERR_READ_UNMAPPED;
                HOOK_FOREACH(uc, hook, UC_HOOK_MEM_READ_UNMAPPED) {
                    if (hook->to_delete)
                        continue;
                    if (!HOOK_BOUND_CHECK(hook, paddr))
                        continue;
                    if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_READ_UNMAPPED, paddr, size, 0, hook->user_data)))
                        break;

                    // the last callback may already asked to stop emulation
                    if (uc->stop_request)
                        break;
                }
            }
        } else {
            error_code = uc->invalid_error;
        }

        if (handled) {
            uc->invalid_error = UC_ERR_OK;
            /* If the TLB entry is for a different page, reload and try again.  */
            if (!tlb_hit(env->uc, tlb_addr, addr)) {
                if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
                                    addr & TARGET_PAGE_MASK)) {
                    tlb_fill(env_cpu(env), addr, size,
                             access_type, mmu_idx, retaddr);
                    index = tlb_index(env, mmu_idx, addr);
                    entry = tlb_entry(env, mmu_idx, addr);
                }
                tlb_addr = code_read ? entry->addr_code : entry->addr_read;
                tlb_addr &= ~TLB_INVALID_MASK;
            }
            paddr = entry->paddr | (addr & ~TARGET_PAGE_MASK);
            mr = uc->memory_mapping(uc, paddr);
            if (mr == NULL) {
                uc->invalid_error = UC_ERR_MAP;
                if (uc->nested_level > 0 && !uc->cpu->stopped) {
                    cpu_exit(uc->cpu);
                    // XXX(@lazymio): We have to exit early so that the target register won't be overwritten
                    //                because qemu might generate tcg code like:
                    //                       qemu_ld_i64 x0,x1,leq,8  sync: 0  dead: 0 1
                    //                where we don't have a change to recover x0 value
                    cpu_loop_exit(uc->cpu);
                }
                return 0;
            }
        } else {
            uc->invalid_addr = paddr;
            uc->invalid_error = error_code;
            // printf("***** Invalid fetch (unmapped memory) at " TARGET_FMT_lx "\n", addr);
            if (uc->nested_level > 0 && !uc->cpu->stopped) {
                cpu_exit(uc->cpu);
                // See comments above
                cpu_loop_exit(uc->cpu);
            }
            return 0;
        }
    }

    // now it is read on mapped memory
    if (!code_read) {
        // this is date reading
        HOOK_FOREACH(uc, hook, UC_HOOK_MEM_READ) {
            if (hook->to_delete)
                continue;
            if (!HOOK_BOUND_CHECK(hook, paddr))
                continue;
            ((uc_cb_hookmem_t)hook->callback)(env->uc, UC_MEM_READ, paddr, size, 0, hook->user_data);

            // the last callback may already asked to stop emulation
            if (uc->stop_request)
                break;
        }

        // callback on non-readable memory
        if (mr != NULL && !(mr->perms & UC_PROT_READ)) {  //non-readable
            handled = false;
            HOOK_FOREACH(uc, hook, UC_HOOK_MEM_READ_PROT) {
                if (hook->to_delete)
                    continue;
                if (!HOOK_BOUND_CHECK(hook, paddr))
                    continue;
                if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_READ_PROT, paddr, size, 0, hook->user_data)))
                    break;

                // the last callback may already asked to stop emulation
                if (uc->stop_request)
                    break;
            }

            if (handled) {
                uc->invalid_error = UC_ERR_OK;
                /* If the TLB entry is for a different page, reload and try again.  */
                if (!tlb_hit(env->uc, tlb_addr, addr)) {
                    if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
                                        addr & TARGET_PAGE_MASK)) {
                        tlb_fill(env_cpu(env), addr, size,
                                 access_type, mmu_idx, retaddr);
                        index = tlb_index(env, mmu_idx, addr);
                        entry = tlb_entry(env, mmu_idx, addr);
                    }
                    tlb_addr = code_read ? entry->addr_code : entry->addr_read;
                    tlb_addr &= ~TLB_INVALID_MASK;
                }
            } else {
                uc->invalid_addr = paddr;
                uc->invalid_error = UC_ERR_READ_PROT;
                // printf("***** Invalid memory read (non-readable) at " TARGET_FMT_lx "\n", addr);
                if (uc->nested_level > 0 && !uc->cpu->stopped) {
                    cpu_exit(uc->cpu);
                    // See comments above
                    cpu_loop_exit(uc->cpu);
                }
                return 0;
            }
        }
    } else {
        // code fetching
        // Unicorn: callback on fetch from NX
        if (mr != NULL && !(mr->perms & UC_PROT_EXEC)) {  // non-executable
            handled = false;
            HOOK_FOREACH(uc, hook, UC_HOOK_MEM_FETCH_PROT) {
                if (hook->to_delete)
                    continue;
                if (!HOOK_BOUND_CHECK(hook, paddr))
                    continue;
                if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_FETCH_PROT, paddr, size, 0, hook->user_data)))
                    break;

                // the last callback may already asked to stop emulation
                if (uc->stop_request)
                    break;
            }

            if (handled) {
                uc->invalid_error = UC_ERR_OK;
            } else {
                uc->invalid_addr = paddr;
                uc->invalid_error = UC_ERR_FETCH_PROT;
                // printf("***** Invalid fetch (non-executable) at " TARGET_FMT_lx "\n", addr);
                if (uc->nested_level > 0 && !uc->cpu->stopped) {
                    cpu_exit(uc->cpu);
                    // See comments above
                    cpu_loop_exit(uc->cpu);
                }
                return 0;
            }
        }
    }

    /* Handle anything that isn't just a straight memory access.  */
    if (unlikely(tlb_addr & ~TARGET_PAGE_MASK)) {
        CPUIOTLBEntry *iotlbentry;
        bool need_swap;

        /* For anything that is unaligned, recurse through full_load.  */
        if ((addr & (size - 1)) != 0) {
            goto do_unaligned_access;
        }

        iotlbentry = &env_tlb(env)->d[mmu_idx].iotlb[index];

        /* Handle watchpoints.  */
        if (unlikely(tlb_addr & TLB_WATCHPOINT)) {
            /* On watchpoint hit, this will longjmp out.  */
            cpu_check_watchpoint(env_cpu(env), addr, size,
                                 iotlbentry->attrs, BP_MEM_READ, retaddr);
        }

        need_swap = size > 1 && (tlb_addr & TLB_BSWAP);

        /* Handle I/O access.  */
        if (likely(tlb_addr & TLB_MMIO)) {
            res = io_readx(env, iotlbentry, mmu_idx, addr, retaddr,
                            access_type, op ^ (need_swap * MO_BSWAP));
            goto _out;
        }

        haddr = (void *)((uintptr_t)addr + entry->addend);

        /*
         * Keep these two load_memop separate to ensure that the compiler
         * is able to fold the entire function to a single instruction.
         * There is a build-time assert inside to remind you of this.  ;-)
         */
        if (unlikely(need_swap)) {
            res = load_memop(haddr, op ^ MO_BSWAP);
            goto _out;
        }
        res = load_memop(haddr, op);
        goto _out;
    }

    /* Handle slow unaligned access (it spans two pages or IO).  */
    if (size > 1
        && unlikely((addr & ~TARGET_PAGE_MASK) + size - 1
                    >= TARGET_PAGE_SIZE)) {
        target_ulong addr1, addr2;
        uint64_t r1, r2;
        unsigned shift;
        int old_size;
    do_unaligned_access:
        addr1 = addr & ~((target_ulong)size - 1);
        addr2 = addr1 + size;
        old_size = uc->size_recur_mem;
        uc->size_recur_mem = size;
        r1 = full_load(env, addr1, oi, retaddr);
        r2 = full_load(env, addr2, oi, retaddr);
        uc->size_recur_mem = old_size;
        shift = (addr & (size - 1)) * 8;

        if (memop_big_endian(op)) {
            /* Big-endian combine.  */
            res = (r1 << shift) | (r2 >> ((size * 8) - shift));
        } else {
            /* Little-endian combine.  */
            res = (r1 >> shift) | (r2 << ((size * 8) - shift));
        }
        res = res & MAKE_64BIT_MASK(0, size * 8);
        goto _out;
    }

    haddr = (void *)((uintptr_t)addr + entry->addend);
    res = load_memop(haddr, op);

_out:
    // Unicorn: callback on successful data read
    if (!code_read) {
        if (!uc->size_recur_mem) { // disabling read callback if in recursive call
            HOOK_FOREACH(uc, hook, UC_HOOK_MEM_READ_AFTER) {
                if (hook->to_delete)
                    continue;
                if (!HOOK_BOUND_CHECK(hook, paddr))
                    continue;
                ((uc_cb_hookmem_t)hook->callback)(env->uc, UC_MEM_READ_AFTER, paddr, size, res, hook->user_data);

                // the last callback may already asked to stop emulation
                if (uc->stop_request)
                    break;
            }
        }
    }

    return res;
}